

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcbormap.cpp
# Opt level: O0

void __thiscall QCborMap::detach(QCborMap *this,qsizetype reserved)

{
  qsizetype qVar1;
  QCborContainerPrivate *in_RSI;
  QCborMap *in_RDI;
  
  QExplicitlySharedDataPointer<QCborContainerPrivate>::data
            ((QExplicitlySharedDataPointer<QCborContainerPrivate> *)0x476d01);
  if (in_RSI == (QCborContainerPrivate *)0x0) {
    qVar1 = size(in_RDI);
    in_RSI = (QCborContainerPrivate *)(qVar1 << 1);
  }
  QCborContainerPrivate::detach(in_RSI,0x476d38);
  QExplicitlySharedDataPointer<QCborContainerPrivate>::operator=(&in_RDI->d,in_RSI);
  return;
}

Assistant:

void QCborMap::detach(qsizetype reserved)
{
    d = QCborContainerPrivate::detach(d.data(), reserved ? reserved : size() * 2);
}